

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  pointer pDVar1;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *this_00;
  pointer __ptr;
  long lVar2;
  
  __ptr = this->data_;
  if (this->len != 0) {
    lVar2 = this->len * 0x70;
    this_00 = &__ptr->notes;
    do {
      std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(this_00);
      pDVar1 = (((_Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                &((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)(this_00 + -1))
                 ->super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>)->
               _M_impl).super__Vector_impl_data._M_start;
      if (pDVar1 != (pointer)0x0) {
        operator_delete(pDVar1,(long)(((_Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
                                        *)&((vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                             *)(this_00 + -1))->
                                           super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                      )->_M_impl).super__Vector_impl_data._M_end_of_storage -
                               (long)pDVar1);
      }
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::~vector((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                 *)(this_00 + -2));
      this_00 = (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                &this_00[4].
                 super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      lVar2 = lVar2 + -0x70;
    } while (lVar2 != 0);
    __ptr = this->data_;
  }
  if (__ptr != (pointer)this->firstElement) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }